

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# minilua.c
# Opt level: O0

void localfunc(LexState *ls)

{
  FuncState *fs_00;
  TString *name;
  FuncState *fs;
  expdesc b;
  expdesc v;
  LexState *ls_local;
  
  fs_00 = ls->fs;
  name = str_checkname(ls);
  new_localvar(ls,name,0);
  init_exp((expdesc *)&b.t,VLOCAL,fs_00->freereg);
  luaK_reserveregs(fs_00,1);
  adjustlocalvars(ls,1);
  body(ls,(expdesc *)&fs,0,ls->linenumber);
  luaK_storevar(fs_00,(expdesc *)&b.t,(expdesc *)&fs);
  fs_00->f->locvars[fs_00->actvar[(int)(fs_00->nactvar - 1)]].startpc = fs_00->pc;
  return;
}

Assistant:

static void localfunc(LexState*ls){
expdesc v,b;
FuncState*fs=ls->fs;
new_localvar(ls,str_checkname(ls),0);
init_exp(&v,VLOCAL,fs->freereg);
luaK_reserveregs(fs,1);
adjustlocalvars(ls,1);
body(ls,&b,0,ls->linenumber);
luaK_storevar(fs,&v,&b);
getlocvar(fs,fs->nactvar-1).startpc=fs->pc;
}